

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall BoolLattice_Join_Test::~BoolLattice_Join_Test(BoolLattice_Join_Test *this)

{
  BoolLattice_Join_Test *this_local;
  
  ~BoolLattice_Join_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BoolLattice, Join) {
  analysis::Bool lattice;
  bool elem = false;

  EXPECT_FALSE(lattice.join(elem, false));
  ASSERT_FALSE(elem);

  EXPECT_TRUE(lattice.join(elem, true));
  ASSERT_TRUE(elem);

  EXPECT_FALSE(lattice.join(elem, false));
  ASSERT_TRUE(elem);

  EXPECT_FALSE(lattice.join(elem, true));
  ASSERT_TRUE(elem);
}